

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

Gia_Man_t * Gia_ManFromIfLogic(If_Man_t *pIfMan)

{
  If_Cut_t *pCut;
  If_Obj_t *pIfObj;
  void *pvVar1;
  Gia_Obj_t *pGVar2;
  word *pwVar3;
  Vec_Mem_t *pVVar4;
  word wVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  Vec_Int_t *p;
  int *piVar11;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Gia_Man_t *pNew;
  Vec_Int_t *vLits;
  Vec_Int_t *vCover;
  Vec_Int_t *p_02;
  Vec_Int_t *vLeavesTemp;
  Vec_Ptr_t *pVVar12;
  Gia_Obj_t *pGVar13;
  word *pwVar14;
  char *__s;
  size_t sVar15;
  char *__dest;
  byte bVar16;
  int Fill;
  int extraout_EDX;
  int extraout_EDX_00;
  long lVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  If_Par_t *pIVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  word *pwVar25;
  ulong uVar26;
  Vec_Int_t *local_60;
  sat_solver *local_58;
  
  pIVar21 = pIfMan->pPars;
  iVar8 = pIVar21->fDeriveLuts;
  if ((iVar8 != 0) && (pIVar21->fTruth == 0)) {
    __assert_fail("!pIfMan->pPars->fDeriveLuts || pIfMan->pPars->fTruth",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                  ,0x6d5,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
  }
  iVar9 = pIfMan->vObjs->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar7 = iVar9;
  }
  p->nCap = iVar7;
  if (iVar7 == 0) {
    piVar11 = (int *)0x0;
  }
  else {
    piVar11 = (int *)malloc((long)iVar7 << 2);
  }
  p->pArray = piVar11;
  p->nSize = iVar9;
  memset(piVar11,0,(long)iVar9 << 2);
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 0x10;
  piVar11 = (int *)malloc(0x40);
  p_00->pArray = piVar11;
  p_00->nSize = 1;
  *piVar11 = 0;
  if ((iVar8 == 0) ||
     ((((pIVar21->pLutStruct == (char *)0x0 && (pIVar21->fEnableCheck75 == 0)) &&
       (pIVar21->fEnableCheck75u == 0)) && (pIVar21->fEnableCheck07 == 0)))) {
    local_60 = (Vec_Int_t *)0x0;
  }
  else {
    local_60 = (Vec_Int_t *)malloc(0x10);
    local_60->nCap = 1000;
    local_60->nSize = 0;
    piVar11 = (int *)malloc(4000);
    local_60->pArray = piVar11;
    Vec_IntPush(local_60,0);
    pIVar21 = pIfMan->pPars;
  }
  if (pIVar21->fUseDsdTune == 0) {
    p_01 = (Vec_Int_t *)0x0;
  }
  else {
    iVar8 = If_DsdManTtBitNum(pIfMan->pIfDsdMan);
    iVar9 = If_DsdManPermBitNum(pIfMan->pIfDsdMan);
    uVar10 = iVar9 + iVar8 + 1;
    p_01 = (Vec_Int_t *)malloc(0x10);
    p_01->nCap = 1000;
    p_01->nSize = 0;
    piVar11 = (int *)malloc(4000);
    p_01->pArray = piVar11;
    Vec_IntPush(p_01,0);
    Vec_IntPush(p_01,(((int)uVar10 >> 5) + 1) - (uint)((uVar10 & 0x1f) == 0));
  }
  pNew = Gia_ManStart(pIfMan->vObjs->nSize);
  vLits = (Vec_Int_t *)malloc(0x10);
  vLits->nCap = 1000;
  vLits->nSize = 0;
  piVar11 = (int *)malloc(4000);
  vLits->pArray = piVar11;
  vCover = (Vec_Int_t *)malloc(0x10);
  vCover->nCap = 0x10000;
  vCover->nSize = 0;
  piVar11 = (int *)malloc(0x40000);
  vCover->pArray = piVar11;
  p_02 = (Vec_Int_t *)malloc(0x10);
  p_02->nCap = 0x10;
  p_02->nSize = 0;
  piVar11 = (int *)malloc(0x40);
  p_02->pArray = piVar11;
  vLeavesTemp = (Vec_Int_t *)malloc(0x10);
  vLeavesTemp->nCap = 0x10;
  vLeavesTemp->nSize = 0;
  piVar11 = (int *)malloc(0x40);
  vLeavesTemp->pArray = piVar11;
  If_ManCleanCutData(pIfMan);
  pVVar12 = pIfMan->vObjs;
  if (pVVar12->nSize < 1) {
    local_58 = (sat_solver *)0x0;
  }
  else {
    lVar17 = 0;
    local_58 = (sat_solver *)0x0;
    do {
      pIfObj = (If_Obj_t *)pVVar12->pArray[lVar17];
      uVar10 = *(uint *)pIfObj;
      if ((uVar10 & 0xe) != 2 && pIfObj->nRefs == 0) goto LAB_006f6857;
      switch(uVar10 & 0xf) {
      case 1:
        (pIfObj->field_22).iCopy = 1;
        if (p->nSize < 1) goto LAB_006f730d;
        *p->pArray = p_00->nSize;
        Vec_IntPush(p_00,0);
        Vec_IntPush(p_00,0);
        break;
      case 2:
        pGVar13 = Gia_ManAppendObj(pNew);
        uVar19 = *(ulong *)pGVar13;
        *(ulong *)pGVar13 = uVar19 | 0x9fffffff;
        *(ulong *)pGVar13 =
             uVar19 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(pNew->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar2 = pNew->pObjs;
        if ((pGVar13 < pGVar2) || (pGVar2 + pNew->nObjs <= pGVar13)) {
LAB_006f7272:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(pNew->vCis,(int)((ulong)((long)pGVar13 - (long)pGVar2) >> 2) * -0x55555555);
        pGVar2 = pNew->pObjs;
        if ((pGVar13 < pGVar2) || (pGVar2 + pNew->nObjs <= pGVar13)) goto LAB_006f7272;
        iVar8 = (int)((ulong)((long)pGVar13 - (long)pGVar2) >> 2) * 0x55555556;
        goto LAB_006f6853;
      case 3:
        uVar20 = (pIfObj->pFanin0->field_22).iCopy;
        if ((int)uVar20 < 0) goto LAB_006f72ee;
        iVar8 = Gia_ManAppendCo(pNew,uVar20 ^ uVar10 >> 4 & 1);
LAB_006f6853:
        (pIfObj->field_22).iCopy = iVar8;
        break;
      case 4:
        pCut = &pIfObj->CutBest;
        pIVar21 = pIfMan->pPars;
        if (((((pIVar21->fUseTtPerm == 0) && (pIVar21->fDelayOpt == 0)) &&
             ((pIVar21->fDelayOptLut == 0 &&
              ((pIVar21->fDsdBalance == 0 && (pIVar21->pLutStruct == (char *)0x0)))))) &&
            (pIVar21->fUserRecLib == 0)) &&
           (((((pIVar21->nGateSize == 0 && (pIVar21->fEnableCheck75 == 0)) &&
              (pIVar21->fEnableCheck75u == 0)) &&
             ((pIVar21->fEnableCheck07 == 0 && (pIVar21->fUseDsdTune == 0)))) &&
            ((pIVar21->fUseCofVars == 0 && (pIVar21->fUseAndVars == 0)))))) {
          If_CutRotatePins(pIfMan,pCut);
        }
        p_02->nSize = 0;
        uVar10 = *(uint *)&(pIfObj->CutBest).field_0x1c;
        uVar19 = (ulong)(uVar10 >> 0x18);
        if (0xffffff < uVar10) {
          uVar22 = 0;
          do {
            iVar8 = *(int *)(&pIfObj[1].field_0x0 + uVar22 * 4);
            if (((long)iVar8 < 0) || (pIfMan->vObjs->nSize <= iVar8)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pvVar1 = pIfMan->vObjs->pArray[iVar8];
            if (pvVar1 == (void *)0x0) break;
            Vec_IntPush(p_02,*(int *)((long)pvVar1 + 0x40));
            uVar22 = uVar22 + 1;
            uVar19 = (ulong)(byte)(pIfObj->CutBest).field_0x1f;
          } while (uVar22 < uVar19);
        }
        pIVar21 = pIfMan->pPars;
        iVar8 = pIVar21->fUseDsd;
        if ((iVar8 == 0) || (pIVar21->pLutStruct == (char *)0x0)) {
          iVar9 = (int)uVar19;
          if (pIVar21->fUseAndVars == 0) {
LAB_006f698a:
            if (pIVar21->fUseCofVars == 0) goto LAB_006f69d4;
LAB_006f698e:
            if (pIVar21->fDeriveLuts != 0) {
              if (pIVar21->nLutSize / 2 < iVar9) goto LAB_006f69a6;
              goto LAB_006f69dd;
            }
LAB_006f69e7:
            if (iVar8 == 0) {
LAB_006f69eb:
              if (pIVar21->fUseTtPerm == 0) {
                uVar10 = Gia_ManNodeIfToGia(pNew,pIfMan,pIfObj,p_02,0);
                (pIfObj->field_22).iCopy = uVar10;
                if ((int)uVar10 < 0) {
LAB_006f72b0:
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                                ,0xf2,"int Abc_Lit2Var(int)");
                }
                uVar10 = uVar10 >> 1;
                iVar8 = p_00->nSize;
                Vec_IntFillExtra(p,uVar10 + 1,Fill);
                if (p->nSize <= (int)uVar10) {
LAB_006f730d:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                                ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
                }
                p->pArray[uVar10] = iVar8;
                Vec_IntPush(p_00,p_02->nSize);
                iVar8 = p_02->nSize;
                if (0 < (long)iVar8) {
                  lVar18 = 0;
                  do {
                    if ((p_02->pArray[lVar18] < 0) || ((pIfObj->field_22).iCopy < 0))
                    goto LAB_006f72b0;
                    if ((uint)(pIfObj->field_22).iCopy >> 1 <= (uint)p_02->pArray[lVar18] >> 1) {
                      __assert_fail("Abc_Lit2Var(Entry) < Abc_Lit2Var(pIfObj->iCopy)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                                    ,0x744,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
                    }
                    lVar18 = lVar18 + 1;
                  } while (iVar8 != lVar18);
                  if (0 < iVar8) {
                    lVar18 = 0;
                    do {
                      if (p_02->pArray[lVar18] < 0) goto LAB_006f72b0;
                      Vec_IntPush(p_00,(uint)p_02->pArray[lVar18] >> 1);
                      lVar18 = lVar18 + 1;
                    } while (lVar18 < p_02->nSize);
                  }
                }
                if ((pIfObj->field_22).iCopy < 0) goto LAB_006f72b0;
                Vec_IntPush(p_00,(uint)(pIfObj->field_22).iCopy >> 1);
                break;
              }
            }
          }
          else {
            if (pIVar21->fUseCofVars != 0) {
              if (pIVar21->fDeriveLuts == 0) goto LAB_006f698e;
              if (iVar9 <= pIVar21->nLutSize / 2) goto LAB_006f694f;
              uVar10 = (pIfObj->CutBest).iCutFunc;
              if ((int)uVar10 < 0) goto LAB_006f72b0;
              uVar10 = uVar10 >> 1;
              if ((int)uVar10 < pIfMan->vTtDecs[uVar19]->nSize) {
                if (pIfMan->vTtDecs[uVar19]->pArray[uVar10] != 0) goto LAB_006f6963;
LAB_006f69a6:
                iVar8 = Gia_ManFromIfLogicCofVars(pNew,pIfMan,pCut,p_02,vLeavesTemp,vCover,p,p_00);
                goto LAB_006f6853;
              }
              goto LAB_006f7215;
            }
            if (pIVar21->fDeriveLuts != 0) {
LAB_006f694f:
              if (pIVar21->nLutSize / 2 < iVar9) {
LAB_006f6963:
                iVar8 = Gia_ManFromIfLogicAndVars(pNew,pIfMan,pCut,p_02,vLeavesTemp,vCover,p,p_00);
                goto LAB_006f6853;
              }
              goto LAB_006f698a;
            }
LAB_006f69d4:
            if (pIVar21->fDeriveLuts == 0) goto LAB_006f69e7;
LAB_006f69dd:
            if (iVar8 == 0 && pIVar21->fTruth == 0) goto LAB_006f69eb;
          }
          uVar10 = (pIfObj->CutBest).iCutFunc;
          if ((int)uVar10 < 0) goto LAB_006f736a;
          pwVar3 = pIfMan->puTempW;
          pVVar4 = pIfMan->vTtMem[uVar19];
          if (pVVar4 == (Vec_Mem_t *)0x0) {
            pwVar14 = (word *)0x0;
          }
          else {
            uVar20 = uVar10 >> 1;
            if (pVVar4->nEntries <= (int)uVar20) goto LAB_006f7405;
            pwVar14 = pVVar4->ppPages[uVar20 >> ((byte)pVVar4->LogPageSze & 0x1f)] +
                      (ulong)(uVar20 & pVVar4->PageMask) * (long)pVVar4->nEntrySize;
          }
          uVar20 = pIfMan->nTruth6Words[uVar19];
          if ((uVar10 & 1) == 0) {
            if (0 < (int)uVar20) {
              uVar19 = 0;
              do {
                pwVar3[uVar19] = pwVar14[uVar19];
                uVar19 = uVar19 + 1;
              } while (uVar20 != uVar19);
            }
          }
          else if (0 < (int)uVar20) {
            uVar19 = 0;
            do {
              pwVar3[uVar19] = ~pwVar14[uVar19];
              uVar19 = uVar19 + 1;
            } while (uVar20 != uVar19);
          }
          if ((pIVar21->fUseTtPerm != 0) &&
             (uVar10 = *(uint *)&(pIfObj->CutBest).field_0x1c, 0xffffff < uVar10)) {
            uVar22 = (ulong)(uVar10 >> 0x18);
            uVar20 = (pIfObj->CutBest).uMaskFunc;
            uVar19 = 0;
            do {
              if ((uVar20 >> ((uint)uVar19 & 0x1f) & 1) != 0) {
                iVar8 = (int)uVar22 + -6;
                uVar24 = 1 << ((byte)iVar8 & 0x1f);
                bVar16 = (byte)(1 << ((byte)uVar19 & 0x1f));
                if ((uVar10 < 0x7000000) || (iVar8 == 0)) {
                  *pwVar3 = (Gia_ManFromIfLogicNode::Truth6[uVar19] & *pwVar3) >> (bVar16 & 0x3f) |
                            *pwVar3 << (bVar16 & 0x3f) & Gia_ManFromIfLogicNode::Truth6[uVar19];
                }
                else if (uVar19 < 6) {
                  if (iVar8 != 0x1f) {
                    uVar22 = Gia_ManFromIfLogicNode::Truth6[uVar19];
                    uVar23 = 0;
                    do {
                      pwVar3[uVar23] =
                           (pwVar3[uVar23] & uVar22) >> (bVar16 & 0x3f) |
                           pwVar3[uVar23] << (bVar16 & 0x3f) & uVar22;
                      uVar23 = uVar23 + 1;
                    } while (uVar24 != uVar23);
                  }
                }
                else if (iVar8 != 0x1f) {
                  bVar16 = (byte)(uVar19 - 6);
                  uVar10 = 1 << (bVar16 & 0x1f);
                  iVar8 = 2 << (bVar16 & 0x1f);
                  uVar22 = 1;
                  if (1 < (int)uVar10) {
                    uVar22 = (ulong)uVar10;
                  }
                  pwVar14 = pwVar3 + (int)uVar10;
                  pwVar25 = pwVar3;
                  do {
                    if (uVar19 - 6 != 0x1f) {
                      uVar23 = 0;
                      do {
                        wVar5 = pwVar25[uVar23];
                        pwVar25[uVar23] = pwVar14[uVar23];
                        pwVar14[uVar23] = wVar5;
                        uVar23 = uVar23 + 1;
                      } while (uVar22 != uVar23);
                    }
                    pwVar25 = pwVar25 + iVar8;
                    pwVar14 = pwVar14 + iVar8;
                  } while (pwVar25 < pwVar3 + (int)uVar24);
                }
              }
              uVar19 = uVar19 + 1;
              uVar10 = *(uint *)&(pIfObj->CutBest).field_0x1c;
              uVar22 = (ulong)(uVar10 >> 0x18);
            } while (uVar19 < uVar22);
          }
          uVar10 = 1;
          if (pIVar21->fEnableCheck75 == 0) {
            uVar10 = (uint)(pIVar21->fEnableCheck75u != 0);
          }
          uVar10 = Gia_ManFromIfLogicNode
                             (pIfMan,pNew,(int)lVar17,p_02,vLeavesTemp,pwVar3,pIVar21->pLutStruct,
                              vCover,p,p_00,local_60,uVar10,pIVar21->fEnableCheck07);
          (pIfObj->field_22).iCopy = uVar10;
          if ((int)uVar10 < 0) goto LAB_006f72ee;
          uVar20 = *(uint *)&(pIfObj->CutBest).field_0x1c >> 0xc & 1 ^ uVar10;
          (pIfObj->field_22).iCopy = uVar20;
          if ((p_01 != (Vec_Int_t *)0x0) && (1 < p_02->nSize)) {
            if (pNew->nObjs <= (int)(uVar10 >> 1)) goto LAB_006f71f6;
            if ((1 < uVar10) &&
               (((uint)*(undefined8 *)(pNew->pObjs + (uVar10 >> 1)) & 0x9fffffff) != 0x9fffffff)) {
              Gia_ManFromIfGetConfig(p_01,pIfMan,pCut,uVar20 & 1);
            }
          }
        }
        else {
          if (local_58 == (sat_solver *)0x0) {
            local_58 = (sat_solver *)If_ManSatBuildXY(*pIVar21->pLutStruct + -0x30);
            pIVar21 = pIfMan->pPars;
            if (pIVar21->pLutStruct != (char *)0x0) goto LAB_006f6762;
LAB_006f68e5:
            uVar10 = (pIfObj->CutBest).iCutFunc;
            if ((int)uVar10 < 0) {
LAB_006f736a:
              __assert_fail("pCut->iCutFunc >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/if.h"
                            ,0x1ab,"word *If_CutTruthW(If_Man_t *, If_Cut_t *)");
            }
            pwVar3 = pIfMan->puTempW;
            bVar16 = (pIfObj->CutBest).field_0x1f;
            pVVar4 = pIfMan->vTtMem[bVar16];
            if (pVVar4 == (Vec_Mem_t *)0x0) {
              pwVar14 = (word *)0x0;
            }
            else {
              uVar20 = uVar10 >> 1;
              if (pVVar4->nEntries <= (int)uVar20) {
LAB_006f7405:
                __assert_fail("i >= 0 && i < p->nEntries",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecMem.h"
                              ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
              }
              pwVar14 = pVVar4->ppPages[uVar20 >> ((byte)pVVar4->LogPageSze & 0x1f)] +
                        (ulong)(uVar20 & pVVar4->PageMask) * (long)pVVar4->nEntrySize;
            }
            uVar20 = pIfMan->nTruth6Words[bVar16];
            if ((uVar10 & 1) == 0) {
              if (0 < (int)uVar20) {
                uVar19 = 0;
                do {
                  pwVar3[uVar19] = pwVar14[uVar19];
                  uVar19 = uVar19 + 1;
                } while (uVar20 != uVar19);
              }
            }
            else if (0 < (int)uVar20) {
              uVar19 = 0;
              do {
                pwVar3[uVar19] = ~pwVar14[uVar19];
                uVar19 = uVar19 + 1;
              } while (uVar20 != uVar19);
            }
            uVar10 = Gia_ManFromIfLogicCreateLut(pNew,pwVar3,p_02,vCover,p,p_00);
          }
          else {
LAB_006f6762:
            if (pIVar21->fDeriveLuts == 0) goto LAB_006f68e5;
            uVar10 = Gia_ManFromIfLogicFindLut
                               (pIfMan,pNew,pCut,local_58,p_02,vLits,vCover,p,p_00,local_60);
          }
          (pIfObj->field_22).iCopy = uVar10;
          if ((int)uVar10 < 0) {
LAB_006f72ee:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf5,"int Abc_LitNotCond(int, int)");
          }
          (pIfObj->field_22).iCopy = *(uint *)&(pIfObj->CutBest).field_0x1c >> 0xc & 1 ^ uVar10;
        }
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                      ,0x756,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
      }
LAB_006f6857:
      lVar17 = lVar17 + 1;
      pVVar12 = pIfMan->vObjs;
    } while (lVar17 < pVVar12->nSize);
  }
  if (vLits->pArray != (int *)0x0) {
    free(vLits->pArray);
  }
  free(vLits);
  if (vCover->pArray != (int *)0x0) {
    free(vCover->pArray);
  }
  free(vCover);
  if (p_02->pArray != (int *)0x0) {
    free(p_02->pArray);
  }
  free(p_02);
  if (vLeavesTemp->pArray != (int *)0x0) {
    free(vLeavesTemp->pArray);
  }
  free(vLeavesTemp);
  iVar8 = extraout_EDX;
  if (local_58 != (sat_solver *)0x0) {
    sat_solver_delete(local_58);
    iVar8 = extraout_EDX_00;
  }
  iVar9 = pNew->nObjs;
  if (iVar9 < p->nSize) {
    p->nSize = iVar9;
  }
  else {
    Vec_IntFillExtra(p,iVar9,iVar8);
    iVar9 = pNew->nObjs;
    if (p->nSize != iVar9) {
      __assert_fail("Vec_IntSize(vMapping) == Gia_ManObjNum(pNew)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                    ,0x769,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
    }
  }
  if (0 < iVar9) {
    piVar11 = p->pArray;
    lVar17 = 0;
    do {
      iVar8 = piVar11[lVar17];
      if (0 < iVar8) {
        piVar11[lVar17] = iVar8 + pNew->nObjs;
        iVar9 = p->nSize;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < iVar9);
  }
  iVar8 = p_00->nSize;
  piVar11 = p_00->pArray;
  if ((long)iVar8 < 1) {
    if (piVar11 == (int *)0x0) goto LAB_006f6f47;
  }
  else {
    lVar17 = 0;
    do {
      Vec_IntPush(p,piVar11[lVar17]);
      lVar17 = lVar17 + 1;
    } while (iVar8 != lVar17);
  }
  free(piVar11);
LAB_006f6f47:
  free(p_00);
  if (pNew->vMapping != (Vec_Int_t *)0x0) {
    __assert_fail("pNew->vMapping == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                  ,0x770,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
  }
  if (pNew->vPacking != (Vec_Int_t *)0x0) {
    __assert_fail("pNew->vPacking == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                  ,0x771,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
  }
  if (pNew->vConfigs != (Vec_Int_t *)0x0) {
    __assert_fail("pNew->vConfigs == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                  ,0x772,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
  }
  if (pNew->pCellStr != (char *)0x0) {
    __assert_fail("pNew->pCellStr == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                  ,0x773,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
  }
  pNew->vMapping = p;
  pNew->vPacking = local_60;
  pNew->vConfigs = p_01;
  if (p_01 == (Vec_Int_t *)0x0) {
    pNew->pCellStr = (char *)0x0;
  }
  else {
    __s = If_DsdManGetCellStr(pIfMan->pIfDsdMan);
    if (__s == (char *)0x0) {
      __dest = (char *)0x0;
    }
    else {
      sVar15 = strlen(__s);
      __dest = (char *)malloc(sVar15 + 1);
      strcpy(__dest,__s);
    }
    pNew->pCellStr = __dest;
    iVar8 = p_01->nSize;
    if ((iVar8 < 1) || (iVar8 == 1)) {
LAB_006f7215:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if (iVar8 != p_01->pArray[1] * *p_01->pArray + 2) {
      __assert_fail("!vConfigs || Vec_IntSize(vConfigs) == 2 + Vec_IntEntry(vConfigs, 0) * Vec_IntEntry(vConfigs, 1)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                    ,0x778,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
    }
  }
  lVar17 = (long)pNew->vCos->nSize;
  if (lVar17 < 1) {
    uVar10 = pNew->nObjs;
  }
  else {
    lVar18 = 0;
    do {
      iVar8 = pNew->vCos->pArray[lVar18];
      if (((long)iVar8 < 0) || (uVar10 = pNew->nObjs, (int)uVar10 <= iVar8)) goto LAB_006f71f6;
      if (pNew->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = pNew->pObjs + iVar8;
      uVar24 = (uint)*(undefined8 *)pGVar2;
      uVar20 = *(uint *)(pGVar2 + -(ulong)(uVar24 & 0x1fffffff));
      if ((~uVar20 & 0x1fffffff) != 0 && -1 < (int)uVar20) {
        uVar20 = iVar8 - (uVar24 & 0x1fffffff);
        if (((int)uVar20 < 0) || (pNew->vMapping->nSize <= (int)uVar20)) goto LAB_006f7215;
        if (pNew->vMapping->pArray[uVar20] == 0) {
          __assert_fail("!Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) || Gia_ObjIsLut(pNew, Gia_ObjFaninId0p(pNew, pObj))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                        ,0x77d,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
        }
      }
      lVar18 = lVar18 + 1;
    } while (lVar17 != lVar18);
  }
  if (1 < (int)uVar10) {
    uVar20 = pNew->vMapping->nSize;
    uVar19 = 1;
    if (1 < (int)uVar20) {
      uVar19 = (ulong)uVar20;
    }
    uVar22 = 1;
    do {
      if (uVar22 == uVar19) goto LAB_006f7215;
      piVar11 = pNew->vMapping->pArray;
      uVar24 = piVar11[uVar22];
      uVar23 = (ulong)uVar24;
      if (uVar23 != 0) {
        if (((int)uVar24 < 0) || (uVar20 <= uVar24)) goto LAB_006f7215;
        uVar24 = piVar11[uVar23];
        uVar6 = uVar24;
        if ((int)uVar24 < 1) {
          uVar6 = 0;
        }
        if (0 < (int)uVar24) {
          uVar26 = 0;
          do {
            uVar24 = piVar11[uVar23 + uVar26 + 1];
            if (uVar10 <= uVar24) goto LAB_006f71f6;
            if ((~*(uint *)(pNew->pObjs + uVar24) & 0x1fffffff) != 0 &&
                -1 < (int)*(uint *)(pNew->pObjs + uVar24)) {
              if ((int)uVar20 <= (int)uVar24) goto LAB_006f7215;
              if (piVar11[uVar24] == 0) {
                __assert_fail("!Gia_ObjIsAnd(pFanin) || Gia_ObjIsLut(pNew, Gia_ObjId(pNew, pFanin))"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                              ,0x784,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
              }
            }
            uVar26 = uVar26 + 1;
          } while (uVar6 != uVar26);
        }
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 != uVar10);
  }
  lVar17 = (long)pNew->vCis->nSize;
  if (0 < lVar17) {
    lVar18 = 0;
    do {
      iVar8 = pNew->vCis->pArray[lVar18];
      if (((long)iVar8 < 0) || ((int)uVar10 <= iVar8)) {
LAB_006f71f6:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pNew->pObjs == (Gia_Obj_t *)0x0) {
        return pNew;
      }
      if (pNew->vMapping->nSize <= iVar8) goto LAB_006f7215;
      if (pNew->vMapping->pArray[iVar8] != 0) {
        __assert_fail("!Gia_ObjIsLut(pNew, Gia_ObjId(pNew, pObj))",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                      ,0x78a,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
      }
      lVar18 = lVar18 + 1;
    } while (lVar17 != lVar18);
  }
  return pNew;
}

Assistant:

Gia_Man_t * Gia_ManFromIfLogic( If_Man_t * pIfMan )
{
    Gia_Man_t * pNew, * pHashed = NULL;
    If_Cut_t * pCutBest;
    If_Obj_t * pIfObj, * pIfLeaf;
    Vec_Int_t * vMapping, * vMapping2, * vPacking = NULL, * vConfigs = NULL;
    Vec_Int_t * vLeaves, * vLeaves2, * vCover, * vLits;
    Ifn_Ntk_t * pNtkCell = NULL;
    sat_solver * pSat = NULL;
    int i, k, Entry;
    assert( !pIfMan->pPars->fDeriveLuts || pIfMan->pPars->fTruth );
//    if ( pIfMan->pPars->fEnableCheck07 )
//        pIfMan->pPars->fDeriveLuts = 0;
    // start mapping and packing
    vMapping  = Vec_IntStart( If_ManObjNum(pIfMan) );
    vMapping2 = Vec_IntStart( 1 );
    if ( pIfMan->pPars->fDeriveLuts && (pIfMan->pPars->pLutStruct || pIfMan->pPars->fEnableCheck75 || pIfMan->pPars->fEnableCheck75u || pIfMan->pPars->fEnableCheck07) )
    {
        vPacking = Vec_IntAlloc( 1000 );
        Vec_IntPush( vPacking, 0 );
    }
    if ( pIfMan->pPars->fUseDsdTune )
    {
        int nTtBitNum = If_DsdManTtBitNum(pIfMan->pIfDsdMan);
        int nPermBitNum = If_DsdManPermBitNum(pIfMan->pIfDsdMan);
        int nConfigInts = Abc_BitWordNum(nTtBitNum + nPermBitNum + 1);
        vConfigs = Vec_IntAlloc( 1000 );
        Vec_IntPush( vConfigs, 0 );
        Vec_IntPush( vConfigs, nConfigInts );
    }
    // create new manager
    pNew = Gia_ManStart( If_ManObjNum(pIfMan) );
    // iterate through nodes used in the mapping
    vLits    = Vec_IntAlloc( 1000 );
    vCover   = Vec_IntAlloc( 1 << 16 );
    vLeaves  = Vec_IntAlloc( 16 );
    vLeaves2 = Vec_IntAlloc( 16 );
    If_ManCleanCutData( pIfMan );
    If_ManForEachObj( pIfMan, pIfObj, i )
    {
        if ( pIfObj->nRefs == 0 && !If_ObjIsTerm(pIfObj) )
            continue;
        if ( If_ObjIsAnd(pIfObj) )
        {
            pCutBest = If_ObjCutBest( pIfObj );
            // perform sorting of cut leaves by delay, so that the slowest pin drives the fastest input of the LUT
            if ( !pIfMan->pPars->fUseTtPerm && !pIfMan->pPars->fDelayOpt && !pIfMan->pPars->fDelayOptLut && !pIfMan->pPars->fDsdBalance && 
                 !pIfMan->pPars->pLutStruct && !pIfMan->pPars->fUserRecLib && !pIfMan->pPars->nGateSize && !pIfMan->pPars->fEnableCheck75 && 
                 !pIfMan->pPars->fEnableCheck75u && !pIfMan->pPars->fEnableCheck07 && !pIfMan->pPars->fUseDsdTune && 
                 !pIfMan->pPars->fUseCofVars && !pIfMan->pPars->fUseAndVars )
                If_CutRotatePins( pIfMan, pCutBest );
            // collect leaves of the best cut
            Vec_IntClear( vLeaves );
            If_CutForEachLeaf( pIfMan, pCutBest, pIfLeaf, k )
                Vec_IntPush( vLeaves, pIfLeaf->iCopy );
            // perform one of the two types of mapping: with and without structures
            if ( pIfMan->pPars->fUseDsd && pIfMan->pPars->pLutStruct )
            {
                if ( pSat == NULL )
                    pSat = (sat_solver *)If_ManSatBuildXY( (int)(pIfMan->pPars->pLutStruct[0] - '0') );
                if ( pIfMan->pPars->pLutStruct && pIfMan->pPars->fDeriveLuts )
                    pIfObj->iCopy = Gia_ManFromIfLogicFindLut( pIfMan, pNew, pCutBest, pSat, vLeaves, vLits, vCover, vMapping, vMapping2, vPacking );
                else
                    pIfObj->iCopy = Gia_ManFromIfLogicCreateLut( pNew, If_CutTruthW(pIfMan, pCutBest), vLeaves, vCover, vMapping, vMapping2 );
                pIfObj->iCopy = Abc_LitNotCond( pIfObj->iCopy, pCutBest->fCompl );
            }
/*
            else if ( pIfMan->pPars->fUseDsd && pIfMan->pPars->fUseDsdTune && pIfMan->pPars->fDeriveLuts )
            {
                if ( pNtkCell == NULL )
                {
                    assert( If_DsdManGetCellStr(pIfMan->pIfDsdMan) != NULL );
                    pNtkCell = Ifn_NtkParse( If_DsdManGetCellStr(pIfMan->pIfDsdMan) );
                    nLutMax = Ifn_NtkLutSizeMax( pNtkCell );
                    pHashed = Gia_ManStart( 10000 );
                    Vec_IntFillExtra( &pHashed->vCopies, 10000, -1 );
                    for ( k = 0; k < pIfMan->pPars->nLutSize; k++ )
                        Gia_ManAppendCi( pHashed );
                    Gia_ManHashAlloc( pHashed );
                }
                pIfObj->iCopy = Gia_ManFromIfLogicFindCell( pIfMan, pNew, pHashed, pCutBest, pNtkCell, nLutMax, vLeaves, vLits, vCover, vMapping, vMapping2, vConfigs );
                pIfObj->iCopy = Abc_LitNotCond( pIfObj->iCopy, pCutBest->fCompl );
            }
*/
            else if ( pIfMan->pPars->fUseAndVars && pIfMan->pPars->fUseCofVars && pIfMan->pPars->fDeriveLuts && (int)pCutBest->nLeaves > pIfMan->pPars->nLutSize/2 )
            {
                int truthId = Abc_Lit2Var(pCutBest->iCutFunc);
                int Mask = Vec_IntEntry(pIfMan->vTtDecs[pCutBest->nLeaves], truthId);
                if ( Mask )
                    pIfObj->iCopy = Gia_ManFromIfLogicAndVars( pNew, pIfMan, pCutBest, vLeaves, vLeaves2, vCover, vMapping, vMapping2 );
                else
                    pIfObj->iCopy = Gia_ManFromIfLogicCofVars( pNew, pIfMan, pCutBest, vLeaves, vLeaves2, vCover, vMapping, vMapping2 );
            }
            else if ( pIfMan->pPars->fUseAndVars && pIfMan->pPars->fDeriveLuts && (int)pCutBest->nLeaves > pIfMan->pPars->nLutSize/2 )
            {
                pIfObj->iCopy = Gia_ManFromIfLogicAndVars( pNew, pIfMan, pCutBest, vLeaves, vLeaves2, vCover, vMapping, vMapping2 );
            }
            else if ( pIfMan->pPars->fUseCofVars && pIfMan->pPars->fDeriveLuts && (int)pCutBest->nLeaves > pIfMan->pPars->nLutSize/2 )
            {
                pIfObj->iCopy = Gia_ManFromIfLogicCofVars( pNew, pIfMan, pCutBest, vLeaves, vLeaves2, vCover, vMapping, vMapping2 );
            }
            else if ( (pIfMan->pPars->fDeriveLuts && pIfMan->pPars->fTruth) || pIfMan->pPars->fUseDsd || pIfMan->pPars->fUseTtPerm )
            {
                word * pTruth = If_CutTruthW(pIfMan, pCutBest);
                if ( pIfMan->pPars->fUseTtPerm )
                    for ( k = 0; k < (int)pCutBest->nLeaves; k++ )
                        if ( If_CutLeafBit(pCutBest, k) )
                            Abc_TtFlip( pTruth, Abc_TtWordNum(pCutBest->nLeaves), k );
                // perform decomposition of the cut
                pIfObj->iCopy = Gia_ManFromIfLogicNode( pIfMan, pNew, i, vLeaves, vLeaves2, pTruth, pIfMan->pPars->pLutStruct, vCover, vMapping, vMapping2, vPacking, (pIfMan->pPars->fEnableCheck75 || pIfMan->pPars->fEnableCheck75u), pIfMan->pPars->fEnableCheck07 );
                pIfObj->iCopy = Abc_LitNotCond( pIfObj->iCopy, pCutBest->fCompl );
                if ( vConfigs && Vec_IntSize(vLeaves) > 1 && !Gia_ObjIsCi(Gia_ManObj(pNew, Abc_Lit2Var(pIfObj->iCopy))) && pIfObj->iCopy > 1 )
                    Gia_ManFromIfGetConfig( vConfigs, pIfMan, pCutBest, Abc_LitIsCompl(pIfObj->iCopy) );
            }
            else
            {
                pIfObj->iCopy = Gia_ManNodeIfToGia( pNew, pIfMan, pIfObj, vLeaves, 0 );
                // write mapping
                Vec_IntSetEntry( vMapping, Abc_Lit2Var(pIfObj->iCopy), Vec_IntSize(vMapping2) );
                Vec_IntPush( vMapping2, Vec_IntSize(vLeaves) );
                Vec_IntForEachEntry( vLeaves, Entry, k )
                    assert( Abc_Lit2Var(Entry) < Abc_Lit2Var(pIfObj->iCopy) );
                Vec_IntForEachEntry( vLeaves, Entry, k )
                    Vec_IntPush( vMapping2, Abc_Lit2Var(Entry)  );
                Vec_IntPush( vMapping2, Abc_Lit2Var(pIfObj->iCopy) );
            }
        }
        else if ( If_ObjIsCi(pIfObj) )
            pIfObj->iCopy = Gia_ManAppendCi(pNew);
        else if ( If_ObjIsCo(pIfObj) )
            pIfObj->iCopy = Gia_ManAppendCo( pNew, Abc_LitNotCond(If_ObjFanin0(pIfObj)->iCopy, If_ObjFaninC0(pIfObj)) );
        else if ( If_ObjIsConst1(pIfObj) )
        {
            pIfObj->iCopy = 1;
            // create const LUT
            Vec_IntWriteEntry( vMapping, 0, Vec_IntSize(vMapping2) );
            Vec_IntPush( vMapping2, 0 );
            Vec_IntPush( vMapping2, 0 );
        }
        else assert( 0 );
    }
    Vec_IntFree( vLits );
    Vec_IntFree( vCover );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vLeaves2 );
    if ( pNtkCell )
        ABC_FREE( pNtkCell );
    if ( pSat )
        sat_solver_delete(pSat);
    if ( pHashed )
        Gia_ManStop( pHashed );
//    printf( "Mapping array size:  IfMan = %d. Gia = %d. Increase = %.2f\n", 
//        If_ManObjNum(pIfMan), Gia_ManObjNum(pNew), 1.0 * Gia_ManObjNum(pNew) / If_ManObjNum(pIfMan) );
    // finish mapping 
    if ( Vec_IntSize(vMapping) > Gia_ManObjNum(pNew) )
        Vec_IntShrink( vMapping, Gia_ManObjNum(pNew) );
    else
        Vec_IntFillExtra( vMapping, Gia_ManObjNum(pNew), 0 );
    assert( Vec_IntSize(vMapping) == Gia_ManObjNum(pNew) );
    Vec_IntForEachEntry( vMapping, Entry, i )
        if ( Entry > 0 )
            Vec_IntAddToEntry( vMapping, i, Gia_ManObjNum(pNew) );
    Vec_IntAppend( vMapping, vMapping2 );
    Vec_IntFree( vMapping2 );
    // attach mapping and packing
    assert( pNew->vMapping == NULL );
    assert( pNew->vPacking == NULL );
    assert( pNew->vConfigs == NULL );
    assert( pNew->pCellStr == NULL );
    pNew->vMapping = vMapping;
    pNew->vPacking = vPacking;
    pNew->vConfigs = vConfigs;
    pNew->pCellStr = vConfigs ? Abc_UtilStrsav( If_DsdManGetCellStr(pIfMan->pIfDsdMan) ) : NULL;
    assert( !vConfigs || Vec_IntSize(vConfigs) == 2 + Vec_IntEntry(vConfigs, 0) * Vec_IntEntry(vConfigs, 1) );
    // verify that COs have mapping
    {
        Gia_Obj_t * pObj;
        Gia_ManForEachCo( pNew, pObj, i )
           assert( !Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) || Gia_ObjIsLut(pNew, Gia_ObjFaninId0p(pNew, pObj)) );
    }
    // verify that internal nodes have mapping
    {
        Gia_Obj_t * pFanin;
        Gia_ManForEachLut( pNew, i )
            Gia_LutForEachFaninObj( pNew, i, pFanin, k )
                assert( !Gia_ObjIsAnd(pFanin) || Gia_ObjIsLut(pNew, Gia_ObjId(pNew, pFanin)) );
    }
    // verify that CIs have no mapping
    {
        Gia_Obj_t * pObj;
        Gia_ManForEachCi( pNew, pObj, i )
           assert( !Gia_ObjIsLut(pNew, Gia_ObjId(pNew, pObj)) );
    }
    return pNew;
}